

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlGenTextureMipmaps(uint id,int width,int height,int format,int *mipmaps)

{
  double dVar1;
  
  (*glad_glBindTexture)(0xde1,id);
  if (((((width < 1) || (height < 1)) || ((width + 0x7fffffffU & width) != 0)) ||
      ((height + 0x7fffffffU & height) != 0)) && (RLGL.ExtSupported.texNPOT != true)) {
    TraceLog(4,"TEXTURE: [ID %i] Failed to generate mipmaps",id);
  }
  else {
    (*glad_glGenerateMipmap)(0xde1);
    if (height < width) {
      height = width;
    }
    dVar1 = log((double)height);
    dVar1 = floor(dVar1 / 0.6931471805599453);
    *mipmaps = (int)dVar1 + 1;
    TraceLog(3,"TEXTURE: [ID %i] Mipmaps generated automatically, total: %i",id);
  }
  (*glad_glBindTexture)(0xde1,0);
  return;
}

Assistant:

void rlGenTextureMipmaps(unsigned int id, int width, int height, int format, int *mipmaps)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    glBindTexture(GL_TEXTURE_2D, id);

    // Check if texture is power-of-two (POT)
    bool texIsPOT = false;

    if (((width > 0) && ((width & (width - 1)) == 0)) &&
        ((height > 0) && ((height & (height - 1)) == 0))) texIsPOT = true;

    if ((texIsPOT) || (RLGL.ExtSupported.texNPOT))
    {
        //glHint(GL_GENERATE_MIPMAP_HINT, GL_DONT_CARE);   // Hint for mipmaps generation algorithm: GL_FASTEST, GL_NICEST, GL_DONT_CARE
        glGenerateMipmap(GL_TEXTURE_2D);    // Generate mipmaps automatically

        #define MIN(a,b) (((a)<(b))? (a):(b))
        #define MAX(a,b) (((a)>(b))? (a):(b))

        *mipmaps = 1 + (int)floor(log(MAX(width, height))/log(2));
        TRACELOG(RL_LOG_INFO, "TEXTURE: [ID %i] Mipmaps generated automatically, total: %i", id, *mipmaps);
    }
    else TRACELOG(RL_LOG_WARNING, "TEXTURE: [ID %i] Failed to generate mipmaps", id);

    glBindTexture(GL_TEXTURE_2D, 0);
#else
    TRACELOG(RL_LOG_WARNING, "TEXTURE: [ID %i] GPU mipmap generation not supported", id);
#endif
}